

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_api.cpp
# Opt level: O0

void __thiscall cppcms::impl::cgi::http::on_async_write_start(http *this)

{
  element_type *p;
  shared_ptr<cppcms::impl::cgi::http> *in_RDI;
  http *in_stack_ffffffffffffffb0;
  weak_ptr<cppcms::impl::cgi::http> *this_00;
  http_watchdog *this_01;
  http *in_stack_ffffffffffffffc8;
  weak_ptr<cppcms::impl::cgi::http> local_28;
  
  update_time(in_stack_ffffffffffffffb0);
  p = std::
      __shared_ptr_access<cppcms::impl::cgi::http_watchdog,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<cppcms::impl::cgi::http_watchdog,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x498867);
  this_00 = &local_28;
  self(in_stack_ffffffffffffffc8);
  this_01 = (http_watchdog *)&stack0xffffffffffffffe8;
  std::weak_ptr<cppcms::impl::cgi::http>::weak_ptr<cppcms::impl::cgi::http,void>(this_00,in_RDI);
  http_watchdog::add(this_01,(weak_http_ptr *)p);
  std::weak_ptr<cppcms::impl::cgi::http>::~weak_ptr((weak_ptr<cppcms::impl::cgi::http> *)0x4988ae);
  std::shared_ptr<cppcms::impl::cgi::http>::~shared_ptr
            ((shared_ptr<cppcms::impl::cgi::http> *)0x4988b8);
  return;
}

Assistant:

void on_async_write_start()
		{
			update_time();
			watchdog_->add(self());
		}